

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shapeutil_coding.cc
# Opt level: O3

bool s2shapeutil::CompactEncodeShape(S2Shape *shape,Encoder *encoder)

{
  int iVar1;
  long lVar2;
  char *__function;
  Encoder *in_R8;
  Span<const_Vector3<double>_> points;
  
  iVar1 = (*shape->_vptr_S2Shape[10])();
  switch(iVar1) {
  case 1:
    lVar2 = __dynamic_cast(shape,&S2Shape::typeinfo,&S2Polygon::Shape::typeinfo,0);
    if (lVar2 == 0) {
      __function = "To down_cast(From *) [To = const S2Polygon::Shape *, From = const S2Shape]";
LAB_00224a9b:
      __assert_fail("f == nullptr || dynamic_cast<To>(f) != nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/base/casts.h"
                    ,0x44,__function);
    }
    S2Polygon::Encode((S2Polygon *)shape[1]._vptr_S2Shape,encoder);
    break;
  default:
    FastEncodeShape(shape,encoder);
    break;
  case 3:
    lVar2 = __dynamic_cast(shape,&S2Shape::typeinfo,&S2PointVectorShape::typeinfo,0);
    if (lVar2 == 0) {
      __function = "To down_cast(From *) [To = const S2PointVectorShape *, From = const S2Shape]";
      goto LAB_00224a9b;
    }
    points.ptr_ = (pointer)((*(long *)&shape[1].id_ - (long)shape[1]._vptr_S2Shape >> 3) *
                           -0x5555555555555555);
    points.len_ = 1;
    s2coding::EncodeS2PointVector
              ((s2coding *)shape[1]._vptr_S2Shape,points,(CodingHint)encoder,in_R8);
    break;
  case 4:
    lVar2 = __dynamic_cast(shape,&S2Shape::typeinfo,&S2LaxPolylineShape::typeinfo,0);
    if (lVar2 == 0) {
      __function = "To down_cast(From *) [To = const S2LaxPolylineShape *, From = const S2Shape]";
      goto LAB_00224a9b;
    }
    S2LaxPolylineShape::Encode((S2LaxPolylineShape *)shape,encoder,COMPACT);
    break;
  case 5:
    lVar2 = __dynamic_cast(shape,&S2Shape::typeinfo,&S2LaxPolygonShape::typeinfo,0);
    if (lVar2 == 0) {
      __function = "To down_cast(From *) [To = const S2LaxPolygonShape *, From = const S2Shape]";
      goto LAB_00224a9b;
    }
    S2LaxPolygonShape::Encode((S2LaxPolygonShape *)shape,encoder,COMPACT);
  }
  return true;
}

Assistant:

bool CompactEncodeShape(const S2Shape& shape, Encoder* encoder) {
  switch (shape.type_tag()) {
    case S2Polygon::Shape::kTypeTag: {
      down_cast<const S2Polygon::Shape*>(&shape)->Encode(encoder);
      return true;
    }
    case S2PointVectorShape::kTypeTag: {
      down_cast<const S2PointVectorShape*>(&shape)->Encode(
          encoder, CodingHint::COMPACT);
      return true;
    }
    case S2LaxPolylineShape::kTypeTag: {
      down_cast<const S2LaxPolylineShape*>(&shape)->Encode(
          encoder, CodingHint::COMPACT);
      return true;
    }
    case S2LaxPolygonShape::kTypeTag: {
      down_cast<const S2LaxPolygonShape*>(&shape)->Encode(
          encoder, CodingHint::COMPACT);
      return true;
    }
    default: {
      return FastEncodeShape(shape, encoder);
    }
  }
}